

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.h
# Opt level: O1

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>::TPZGeoBlend
          (TPZGeoBlend<pzgeom::TPZGeoQuad> *this,TPZGeoBlend<pzgeom::TPZGeoQuad> *cp,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcNdMap)

{
  long lVar1;
  
  TPZNodeRep<4,_pztopology::TPZQuadrilateral>::TPZNodeRep
            ((TPZNodeRep<4,_pztopology::TPZQuadrilateral> *)this,&PTR_PTR_018b6600,
             (TPZNodeRep<4,_pztopology::TPZQuadrilateral> *)cp,gl2lcNdMap);
  (this->super_TPZGeoQuad).super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.super_TPZQuadrilateral.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoBlend_018b65a0;
  lVar1 = 0x40;
  do {
    *(undefined ***)
     ((long)(this->super_TPZGeoQuad).super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes
     + lVar1 + -0x18) = &PTR__TPZGeoElSideIndex_018a3510;
    *(undefined4 *)
     ((long)(this->super_TPZGeoQuad).super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes
     + lVar1 + -8) = 0xffffffff;
    *(undefined8 *)
     ((long)(this->super_TPZGeoQuad).super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes
     + lVar1 + -0x10) = 0xffffffffffffffff;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0xd0);
  lVar1 = 0;
  do {
    TPZTransform<double>::TPZTransform((TPZTransform<double> *)(&this->field_0xc0 + lVar1));
    lVar1 = lVar1 + 0x1a0;
  } while (lVar1 != 0x9c0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Please implement me\n",0x14);
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Geom/tpzgeoblend.h",
             0x35);
}

Assistant:

TPZGeoBlend(const TPZGeoBlend &cp, std::map<int64_t, int64_t> &gl2lcNdMap) : TPZRegisterClassId(
                &TPZGeoBlend::ClassId), TGeo(cp, gl2lcNdMap) {
             std::cout << "Please implement me\n";
             DebugStop();
        }